

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  Layer *pLVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int _h;
  Mat bottom_blob_int8;
  code *local_98;
  code *local_90;
  Mat local_88;
  size_t local_50;
  Option opt_g;
  
  local_88.dims = bottom_blob->dims;
  if (local_88.dims != 3) {
LAB_0010befc:
    iVar5 = Convolution::forward(&this->super_Convolution,bottom_blob,top_blob,opt);
    return iVar5;
  }
  iVar5 = (this->super_Convolution).kernel_w;
  if (iVar5 != (this->super_Convolution).kernel_h) goto LAB_0010befc;
  iVar2 = (this->super_Convolution).stride_w;
  if (((iVar2 != (this->super_Convolution).stride_h) || (5 < iVar2 || 5 < iVar5)) ||
     (iVar7 = (this->super_Convolution).dilation_w, iVar7 != (this->super_Convolution).dilation_h))
  goto LAB_0010befc;
  if ((this->super_Convolution).use_int8_inference == true) {
    local_98 = (code *)(&PTR_conv1x1s1_int8_sse_00144740)[((long)iVar5 + -1) * 5 + (long)iVar2 + -1]
    ;
    if (local_98 == (code *)0x0) goto LAB_0010befc;
    local_90 = (code *)0x0;
  }
  else {
    local_90 = (code *)(&PTR_conv1x1s1_sse_00144670)[((long)iVar5 + -1) * 5 + (long)iVar2 + -1];
    if (local_90 == (code *)0x0) goto LAB_0010befc;
    if (iVar7 != 1) {
      if (iVar2 == 1) {
        iVar5 = (*(this->super_Convolution).super_Layer._vptr_Layer[8])
                          (this,bottom_blob,top_blob,local_90,opt);
        return iVar5;
      }
      goto LAB_0010befc;
    }
    local_98 = (code *)0x0;
  }
  iVar7 = bottom_blob->w;
  _h = bottom_blob->h;
  iVar6 = bottom_blob->c;
  local_88.elemsize = bottom_blob->elemsize;
  local_88.data = bottom_blob->data;
  local_88.refcount = bottom_blob->refcount;
  local_88.allocator = bottom_blob->allocator;
  if (local_88.refcount != (int *)0x0) {
    LOCK();
    *local_88.refcount = *local_88.refcount + 1;
    UNLOCK();
  }
  local_88.w = bottom_blob->w;
  local_88.h = bottom_blob->h;
  local_88.c = bottom_blob->c;
  local_88.cstep = bottom_blob->cstep;
  local_50 = local_88.elemsize;
  if ((local_88.elemsize != 1 & (this->super_Convolution).use_int8_inference) == 1) {
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.elemsize = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar7,_h,iVar6,1,opt->workspace_allocator);
    bVar4 = bottom_blob_int8.data == (void *)0x0 ||
            (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    if (bVar4) {
      Mat::~Mat(&bottom_blob_int8);
      iVar6 = -100;
      goto LAB_0010c20c;
    }
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.blob_allocator = bottom_blob_int8.allocator;
    pLVar3 = (this->super_Convolution).quantize;
    (*pLVar3->_vptr_Layer[5])(pLVar3,bottom_blob);
    Mat::operator=(&local_88,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
    iVar6 = -100;
    if (bVar4) goto LAB_0010c20c;
  }
  bottom_blob_int8.data = local_88.data;
  bottom_blob_int8.refcount = local_88.refcount;
  bottom_blob_int8.elemsize = local_88.elemsize;
  bottom_blob_int8.allocator = local_88.allocator;
  bottom_blob_int8.dims = local_88.dims;
  if (local_88.refcount != (int *)0x0) {
    LOCK();
    *local_88.refcount = *local_88.refcount + 1;
    UNLOCK();
  }
  bottom_blob_int8.w = local_88.w;
  bottom_blob_int8.h = local_88.h;
  bottom_blob_int8.c = local_88.c;
  bottom_blob_int8.cstep = local_88.cstep;
  iVar6 = (this->super_Convolution).pad_w;
  if ((iVar6 < 1) && (iVar8 = (this->super_Convolution).pad_h, iVar8 < 1)) {
    if (iVar8 == -0xe9 && iVar6 == -0xe9) {
      iVar8 = ~((iVar7 + -1) % iVar2) + iVar5;
      iVar6 = ~((_h + -1) % iVar2) + iVar5;
      if ((iVar8 < 1) && (iVar6 < 1)) {
LAB_0010c1bb:
        bVar4 = true;
        iVar7 = bottom_blob_int8.w;
        _h = bottom_blob_int8.h;
      }
      else {
        copy_make_border(&local_88,&bottom_blob_int8,iVar6 / 2,iVar6 - iVar6 / 2,iVar8 / 2,
                         iVar8 - iVar8 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        if (bottom_blob_int8.data == (void *)0x0) {
          bVar4 = false;
        }
        else {
          if ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0) goto LAB_0010c1bb;
          bVar4 = false;
        }
      }
      iVar6 = -100;
      if (!bVar4) goto LAB_0010c202;
    }
LAB_0010c06f:
    Mat::create(top_blob,(iVar7 - iVar5) / iVar2 + 1,(_h - iVar5) / iVar2 + 1,
                (this->super_Convolution).num_output,local_50,opt->blob_allocator);
    iVar6 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      pMVar1 = &(this->super_Convolution).weight_data;
      if ((this->super_Convolution).use_int8_inference == true) {
        (*local_98)(&bottom_blob_int8,top_blob,pMVar1,opt);
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.blob_allocator = top_blob->allocator;
        pLVar3 = (this->super_Convolution).dequantize;
        (*pLVar3->_vptr_Layer[7])(pLVar3,top_blob);
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        (*local_90)(&bottom_blob_int8,top_blob,pMVar1,&(this->super_Convolution).bias_data,opt);
      }
    }
  }
  else {
    iVar7 = (this->super_Convolution).pad_h;
    copy_make_border(&local_88,&bottom_blob_int8,iVar7,iVar7,iVar6,iVar6,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    iVar6 = -100;
    if ((bottom_blob_int8.data != (void *)0x0) &&
       (iVar7 = bottom_blob_int8.w, _h = bottom_blob_int8.h,
       (long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) goto LAB_0010c06f;
  }
LAB_0010c202:
  Mat::~Mat(&bottom_blob_int8);
LAB_0010c20c:
  Mat::~Mat(&local_88);
  return iVar6;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;

    if (kernel_size > 5 || stride > 5 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[5][5] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            0,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    typedef void (*conv_int8_func)(const Mat&, Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_int8_func conv_int8_func_table[5][5] =
    {
        {
            conv1x1s1_int8_sse,
            conv1x1s2_int8_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_sse,
            conv3x3s2_int8_sse,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            0,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    conv_func conv = 0;
    conv_int8_func conv_int8 = 0;

    if (use_int8_inference)
    {
        conv_int8 = conv_int8_func_table[kernel_size-1][stride-1];
        if (!conv_int8)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        conv_int8(bottom_blob_bordered, top_blob, weight_data, opt);

        // dequantize, reverse scale inplace
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = top_blob.allocator;

            dequantize->forward_inplace(top_blob, opt_g);
        }

        return 0;
    }

    conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

    return 0;
}